

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O1

void __thiscall icu_63::RBBISymbolTableEntry::~RBBISymbolTableEntry(RBBISymbolTableEntry *this)

{
  RBBINode *pRVar1;
  void *in_RSI;
  
  pRVar1 = this->val->fLeftChild;
  if (pRVar1 != (RBBINode *)0x0) {
    RBBINode::~RBBINode(pRVar1);
    UMemory::operator_delete((UMemory *)pRVar1,in_RSI);
  }
  pRVar1 = this->val;
  pRVar1->fLeftChild = (RBBINode *)0x0;
  if (pRVar1 != (RBBINode *)0x0) {
    RBBINode::~RBBINode(pRVar1);
    UMemory::operator_delete((UMemory *)pRVar1,in_RSI);
  }
  icu_63::UnicodeString::~UnicodeString(&this->key);
  return;
}

Assistant:

RBBISymbolTableEntry::~RBBISymbolTableEntry() {
    // The "val" of a symbol table entry is a variable reference node.
    // The l. child of the val is the rhs expression from the assignment.
    // Unlike other node types, children of variable reference nodes are not
    //    automatically recursively deleted.  We do it manually here.
    delete val->fLeftChild;
    val->fLeftChild = NULL;

    delete  val;

    // Note: the key UnicodeString is destructed by virtue of being in the object by value.
}